

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O0

int main(void)

{
  Hub h;
  Hub *this;
  anon_class_1_0_00000001 *__f;
  Context in_stack_fffffffffffffb30;
  bool in_stack_fffffffffffffb4b;
  int in_stack_fffffffffffffb4c;
  Hub *in_stack_fffffffffffffb50;
  undefined1 local_490 [56];
  
  uWS::Hub::Hub(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,in_stack_fffffffffffffb4b);
  this = (Hub *)&stack0xfffffffffffffba8;
  __f = (anon_class_1_0_00000001 *)&stack0xfffffffffffffb50;
  std::function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)>::
  function<main::__0,void>
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *)
             in_stack_fffffffffffffb30.context,__f);
  uWS::Group<true>::onMessage(this,__f);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)>::~function
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *)0x1032b1);
  uS::TLS::Context::Context((Context *)&stack0xfffffffffffffb30,(SSL_CTX *)0x0);
  uWS::Hub::listen((int)local_490,(Context)0xbb8,(int)&stack0xfffffffffffffb30,(Group *)0x0);
  uS::TLS::Context::~Context((Context *)&stack0xfffffffffffffb30);
  uS::Node::run();
  uWS::Hub::~Hub(this);
  return 0;
}

Assistant:

int main()
{
    uWS::Hub h;

    h.onMessage([](uWS::WebSocket<uWS::SERVER> ws, char *message, size_t length, uWS::OpCode opCode) {
        ws.send(message, length, opCode);
    });

    h.listen(3000);
    h.run();
}